

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

int __thiscall CLI::Option::get_items_expected(Option *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  if ((this->super_OptionBase<CLI::Option>).multi_option_policy_ == Throw) {
    if (this->expected_ < 0) {
      uVar3 = this->type_size_ >> 0x1f | 1;
    }
    else {
      uVar3 = 1;
    }
  }
  else {
    uVar3 = 0xffffffff;
  }
  iVar2 = this->expected_ * this->type_size_;
  iVar1 = -iVar2;
  if (0 < iVar2) {
    iVar1 = iVar2;
  }
  return iVar1 * uVar3;
}

Assistant:

int get_items_expected() const {
        return std::abs(type_size_ * expected_) *
               ((multi_option_policy_ != MultiOptionPolicy::Throw || (expected_ < 0 && type_size_ < 0) ? -1 : 1));
    }